

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cpp
# Opt level: O2

string * __thiscall json::literal::dump_abi_cxx11_(string *__return_storage_ptr__,literal *this)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  if (this->_lvalue == falsevalue) {
    pcVar2 = "false";
    paVar1 = &local_a;
  }
  else if (this->_lvalue == nullvalue) {
    pcVar2 = "null";
    paVar1 = &local_9;
  }
  else {
    pcVar2 = "true";
    paVar1 = &local_b;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string json::literal::dump () const
{
       if (_lvalue == nullvalue)  return "null";
  else if (_lvalue == falsevalue) return "false";
  else                            return "true";
}